

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Client_Subscriptions_addMonitoredItem
          (UA_Client *client,UA_UInt32 subscriptionId,UA_NodeId nodeId,UA_UInt32 attributeID,
          UA_MonitoredItemHandlingFunction hf,void *hfContext,UA_UInt32 *newMonitoredItemId)

{
  long *__ptr;
  long lVar1;
  UA_UInt32 *pUVar2;
  undefined8 *puVar3;
  byte bVar4;
  UA_CreateMonitoredItemsRequest in_stack_fffffffffffffd48;
  UA_StatusCode local_214;
  undefined1 local_210 [4];
  UA_StatusCode retval;
  UA_CreateMonitoredItemsResponse response;
  UA_MonitoredItemCreateRequest item;
  UA_CreateMonitoredItemsRequest request;
  UA_Client_MonitoredItem *newMon;
  UA_Client_Subscription *sub;
  UA_UInt32 *newMonitoredItemId_local;
  void *hfContext_local;
  UA_MonitoredItemHandlingFunction hf_local;
  UA_UInt32 attributeID_local;
  UA_UInt32 subscriptionId_local;
  UA_Client *client_local;
  
  bVar4 = 0;
  for (newMon = (UA_Client_MonitoredItem *)(client->subscriptions).lh_first;
      (newMon != (UA_Client_MonitoredItem *)0x0 &&
      ((newMon->monitoredNodeId).identifier.numeric != subscriptionId));
      newMon = (newMon->listEntry).le_next) {
  }
  if (newMon == (UA_Client_MonitoredItem *)0x0) {
    client_local._4_4_ = 0x80280000;
  }
  else {
    __ptr = (long *)malloc(0x58);
    if (__ptr == (long *)0x0) {
      client_local._4_4_ = 0x80030000;
    }
    else {
      UA_CreateMonitoredItemsRequest_init
                ((UA_CreateMonitoredItemsRequest *)&item.requestedParameters.queueSize);
      UA_MonitoredItemCreateRequest_init((UA_MonitoredItemCreateRequest *)&response.diagnosticInfos)
      ;
      response.diagnosticInfos = (UA_DiagnosticInfo *)nodeId._0_8_;
      item.itemToMonitor.nodeId._0_8_ = nodeId.identifier.string.length;
      item.itemToMonitor.nodeId.identifier.string.length = (size_t)nodeId.identifier.string.data;
      item.itemToMonitor.dataEncoding.name.data._0_4_ = 2;
      item.monitoringMode = client->monitoredItemHandles + UA_MONITORINGMODE_SAMPLING;
      client->monitoredItemHandles = item.monitoringMode;
      item.requestedParameters._0_8_ = *(undefined8 *)&newMon->monitoredNodeId;
      item.requestedParameters.filter.content._36_1_ = 1;
      item.requestedParameters.filter.content._32_4_ = 1;
      pUVar2 = &item.requestedParameters.queueSize;
      puVar3 = (undefined8 *)&stack0xfffffffffffffd48;
      item.itemToMonitor.nodeId.identifier._8_4_ = attributeID;
      for (lVar1 = 0x11; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *(undefined8 *)pUVar2;
        pUVar2 = pUVar2 + (ulong)bVar4 * -4 + 2;
        puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
      }
      UA_Client_Service_createMonitoredItems
                ((UA_CreateMonitoredItemsResponse *)local_210,client,in_stack_fffffffffffffd48);
      local_214 = response.responseHeader.timestamp._4_4_;
      if (response.responseHeader.timestamp._4_4_ == 0) {
        if (response.responseHeader.additionalHeader.content.encoded.body.data == (UA_Byte *)0x1) {
          local_214 = *(UA_StatusCode *)response.resultsSize;
        }
        else {
          local_214 = 0x80010000;
        }
      }
      if (local_214 == 0) {
        *(undefined4 *)((long)__ptr + 0x14) = 2;
        UA_NodeId_copy(&nodeId,(UA_NodeId *)(__ptr + 3));
        *(UA_UInt32 *)(__ptr + 6) = attributeID;
        *(UA_UInt32 *)((long)__ptr + 0x34) = client->monitoredItemHandles;
        __ptr[7] = *(long *)&newMon->monitoredNodeId;
        *(undefined4 *)(__ptr + 8) = 1;
        *(undefined1 *)((long)__ptr + 0x44) = 1;
        __ptr[9] = (long)hf;
        __ptr[10] = (long)hfContext;
        *(undefined4 *)(__ptr + 2) = *(undefined4 *)(response.resultsSize + 4);
        lVar1._0_4_ = newMon->attributeID;
        lVar1._4_4_ = newMon->clientHandle;
        *__ptr = lVar1;
        if (lVar1 != 0) {
          *(long **)(*(long *)&newMon->attributeID + 8) = __ptr;
        }
        *(long **)&newMon->attributeID = __ptr;
        __ptr[1] = (long)&newMon->attributeID;
        *newMonitoredItemId = *(UA_UInt32 *)(__ptr + 2);
        UA_LOG_DEBUG((client->config).logger,UA_LOGCATEGORY_CLIENT,
                     "Created a monitored item with client handle %u",
                     (ulong)client->monitoredItemHandles);
        UA_CreateMonitoredItemsResponse_deleteMembers((UA_CreateMonitoredItemsResponse *)local_210);
        client_local._4_4_ = 0;
      }
      else {
        free(__ptr);
        UA_CreateMonitoredItemsResponse_deleteMembers((UA_CreateMonitoredItemsResponse *)local_210);
        client_local._4_4_ = local_214;
      }
    }
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_addMonitoredItem(UA_Client *client, UA_UInt32 subscriptionId,
                                         UA_NodeId nodeId, UA_UInt32 attributeID,
                                         UA_MonitoredItemHandlingFunction hf,
                                         void *hfContext, UA_UInt32 *newMonitoredItemId) {
    UA_Client_Subscription *sub;
    LIST_FOREACH(sub, &client->subscriptions, listEntry) {
        if(sub->subscriptionID == subscriptionId)
            break;
    }
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    /* Create the handler */
    UA_Client_MonitoredItem *newMon = UA_malloc(sizeof(UA_Client_MonitoredItem));
    if(!newMon)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Send the request */
    UA_CreateMonitoredItemsRequest request;
    UA_CreateMonitoredItemsRequest_init(&request);
    request.subscriptionId = subscriptionId;
    UA_MonitoredItemCreateRequest item;
    UA_MonitoredItemCreateRequest_init(&item);
    item.itemToMonitor.nodeId = nodeId;
    item.itemToMonitor.attributeId = attributeID;
    item.monitoringMode = UA_MONITORINGMODE_REPORTING;
    item.requestedParameters.clientHandle = ++(client->monitoredItemHandles);
    item.requestedParameters.samplingInterval = sub->publishingInterval;
    item.requestedParameters.discardOldest = true;
    item.requestedParameters.queueSize = 1;
    request.itemsToCreate = &item;
    request.itemsToCreateSize = 1;
    UA_CreateMonitoredItemsResponse response = UA_Client_Service_createMonitoredItems(client, request);

    // slight misuse of retval here to check if the addition was successfull.
    UA_StatusCode retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD) {
        if(response.resultsSize == 1)
            retval = response.results[0].statusCode;
        else
            retval = UA_STATUSCODE_BADUNEXPECTEDERROR;
    }
    if(retval != UA_STATUSCODE_GOOD) {
        UA_free(newMon);
        UA_CreateMonitoredItemsResponse_deleteMembers(&response);
        return retval;
    }

    /* Set the handler */
    newMon->monitoringMode = UA_MONITORINGMODE_REPORTING;
    UA_NodeId_copy(&nodeId, &newMon->monitoredNodeId);
    newMon->attributeID = attributeID;
    newMon->clientHandle = client->monitoredItemHandles;
    newMon->samplingInterval = sub->publishingInterval;
    newMon->queueSize = 1;
    newMon->discardOldest = true;
    newMon->handler = hf;
    newMon->handlerContext = hfContext;
    newMon->monitoredItemId = response.results[0].monitoredItemId;
    LIST_INSERT_HEAD(&sub->monitoredItems, newMon, listEntry);
    *newMonitoredItemId = newMon->monitoredItemId;

    UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_CLIENT,
                 "Created a monitored item with client handle %u",
                 client->monitoredItemHandles);

    UA_CreateMonitoredItemsResponse_deleteMembers(&response);
    return UA_STATUSCODE_GOOD;
}